

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  U32 UVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  int *piVar11;
  BYTE *pBVar12;
  int *piVar13;
  int iVar14;
  int *ip;
  ulong uVar15;
  int *ip_00;
  int *piVar16;
  BYTE *pBVar17;
  long lVar18;
  seqDef *psVar19;
  ulong uVar20;
  uint local_f0;
  uint local_ec;
  size_t ofbCandidate;
  ulong local_d8;
  ZSTD_matchState_t *local_d0;
  int *local_c8;
  size_t local_c0;
  BYTE *local_b8;
  BYTE *local_b0;
  int *local_a8;
  BYTE *local_a0;
  int *local_98;
  int local_90;
  int local_8c;
  int local_88;
  uint local_84;
  seqStore_t *local_80;
  int *local_78;
  int *local_70;
  BYTE *local_68;
  BYTE *local_60;
  uint *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  int *local_38;
  
  local_b8 = (ms->window).base;
  uVar7 = (ms->window).dictLimit;
  local_d8 = (ulong)uVar7;
  uVar5 = (ms->cParams).minMatch;
  uVar6 = 6;
  if (uVar5 < 6) {
    uVar6 = uVar5;
  }
  uVar5 = 4;
  if (4 < uVar6) {
    uVar5 = uVar6;
  }
  local_b0 = local_b8 + local_d8;
  local_f0 = *rep;
  pZVar2 = ms->dictMatchState;
  local_a8 = (int *)(pZVar2->window).nextSrc;
  local_a0 = (pZVar2->window).base;
  local_60 = local_a0 + (pZVar2->window).dictLimit;
  iVar14 = (int)local_a8;
  uVar6 = ((int)src - ((int)local_b0 + (int)local_60)) + iVar14;
  ip = (int *)((long)src + (ulong)(uVar6 == 0));
  if (uVar6 < local_f0) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_ec = rep[1];
  local_58 = rep;
  if (uVar6 < local_ec) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_98 = (int *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  local_84 = ((int)local_a0 - iVar14) + uVar7;
  local_68 = local_a0 + -(ulong)local_84;
  local_70 = iEnd + -8;
  iVar10 = (int)local_b8;
  local_88 = (1 - uVar7) - iVar10;
  local_90 = -iVar10;
  local_8c = (((iVar14 - uVar7) - (int)local_a0) - iVar10) + 1;
  local_d0 = ms;
  piVar16 = (int *)src;
  local_80 = seqStore;
  do {
    while( true ) {
      local_c8 = piVar16;
      if (local_98 <= ip) {
        *local_58 = local_f0;
        local_58[1] = local_ec;
        return (long)iEnd - (long)local_c8;
      }
      piVar16 = (int *)((long)ip + 1);
      iVar14 = (int)ip;
      uVar7 = ((iVar14 - (int)local_b8) - local_f0) + 1;
      piVar13 = (int *)(local_b8 + uVar7);
      if (uVar7 < (uint)local_d8) {
        piVar13 = (int *)(local_a0 + (uVar7 - local_84));
      }
      if ((uVar7 - (uint)local_d8 < 0xfffffffd) && (*piVar13 == *piVar16)) {
        piVar11 = iEnd;
        if (uVar7 < (uint)local_d8) {
          piVar11 = local_a8;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)(piVar13 + 1),(BYTE *)iEnd,(BYTE *)piVar11
                           ,local_b0);
        uVar15 = sVar8 + 4;
      }
      else {
        uVar15 = 0;
      }
      ofbCandidate = 999999999;
      if (uVar5 == 6) {
        uVar9 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6(ms,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate)
        ;
      }
      else if (uVar5 == 5) {
        uVar9 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5(ms,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate)
        ;
      }
      else {
        uVar9 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4(ms,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate)
        ;
      }
      uVar20 = uVar15;
      if (uVar15 < uVar9) {
        uVar20 = uVar9;
      }
      if (3 < uVar20) break;
      uVar15 = (long)ip - (long)local_c8;
      ip = (int *)((long)ip + (uVar15 >> 8) + 1);
      ms->lazySkipping = (uint)(0x7ff < uVar15);
      piVar16 = local_c8;
    }
    local_c0 = 1;
    if (uVar15 < uVar9) {
      piVar16 = ip;
      local_c0 = ofbCandidate;
    }
    local_40 = (ulong)((local_88 - local_f0) + iVar14);
    local_48 = (ulong)((local_90 - local_f0) + iVar14);
    local_50 = (ulong)((local_8c - local_f0) + iVar14);
    piVar13 = ip;
    for (lVar18 = 0; (int *)((long)ip + lVar18) < local_98; lVar18 = lVar18 + 1) {
      ip_00 = (int *)((long)ip + lVar18 + 1);
      iVar14 = (int)lVar18;
      uVar7 = (int)local_48 + iVar14 + 1;
      piVar11 = (int *)(local_b8 + uVar7);
      if (uVar7 < (uint)local_d8) {
        piVar11 = (int *)(local_a0 + (uint)((int)local_50 + iVar14));
      }
      local_78 = piVar16;
      local_38 = piVar13;
      if (((uint)((int)local_40 + iVar14) < 0xfffffffd) && (*piVar11 == *ip_00)) {
        piVar16 = iEnd;
        if (uVar7 < (uint)local_d8) {
          piVar16 = local_a8;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + lVar18 + 5),(BYTE *)(piVar11 + 1),(BYTE *)iEnd,
                           (BYTE *)piVar16,local_b0);
        uVar7 = ZSTD_highbit32((U32)local_c0);
        if ((sVar8 < 0xfffffffffffffffc) &&
           ((int)(((int)uVar20 * 3 - uVar7) + 1) < (int)(sVar8 + 4) * 3)) {
          local_c0 = 1;
          uVar20 = sVar8 + 4;
          local_78 = ip_00;
        }
      }
      ofbCandidate = 999999999;
      if (uVar5 == 6) {
        uVar15 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                           (local_d0,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (uVar5 == 5) {
        uVar15 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                           (local_d0,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar15 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                           (local_d0,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      sVar8 = ofbCandidate;
      uVar7 = ZSTD_highbit32((U32)ofbCandidate);
      uVar6 = ZSTD_highbit32((U32)local_c0);
      piVar16 = local_78;
      seqStore = local_80;
      if ((uVar15 < 4) || ((int)((int)uVar15 * 4 - uVar7) <= (int)(((int)uVar20 * 4 - uVar6) + 4)))
      break;
      piVar13 = (int *)((long)local_38 + 1);
      local_c0 = sVar8;
      piVar16 = piVar13;
      uVar20 = uVar15;
    }
    UVar3 = (U32)local_c0;
    if (3 < local_c0) {
      uVar15 = (long)piVar16 + (-(long)local_b8 - local_c0) + -0xfffffffd;
      pBVar12 = local_b8;
      pBVar17 = local_b0;
      if ((uint)uVar15 < (uint)local_d8) {
        pBVar12 = local_68;
        pBVar17 = local_60;
      }
      pBVar12 = pBVar12 + (uVar15 & 0xffffffff);
      for (; ((local_c8 < piVar16 && (pBVar17 < pBVar12)) &&
             (*(BYTE *)((long)piVar16 + -1) == pBVar12[-1])); piVar16 = (int *)((long)piVar16 + -1))
      {
        pBVar12 = pBVar12 + -1;
        uVar20 = uVar20 + 1;
      }
      local_ec = local_f0;
      local_f0 = UVar3 - 3;
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001c377d:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_001c379c:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar15 = (long)piVar16 - (long)local_c8;
    pBVar17 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar17 + uVar15) {
LAB_001c37da:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < piVar16) {
LAB_001c37f9:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_70 < piVar16) {
      ZSTD_safecopyLiterals(pBVar17,(BYTE *)local_c8,(BYTE *)piVar16,(BYTE *)local_70);
LAB_001c34ed:
      seqStore->lit = seqStore->lit + uVar15;
      if (0xffff < uVar15) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar4 = *(undefined8 *)(local_c8 + 2);
      *(undefined8 *)pBVar17 = *(undefined8 *)local_c8;
      *(undefined8 *)(pBVar17 + 8) = uVar4;
      pBVar17 = seqStore->lit;
      if (0x10 < uVar15) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar17 + 0x10 + (-0x10 - (long)(local_c8 + 4))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar4 = *(undefined8 *)(local_c8 + 6);
        *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)(local_c8 + 4);
        *(undefined8 *)(pBVar17 + 0x18) = uVar4;
        if (0x20 < (long)uVar15) {
          lVar18 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_c8 + lVar18 + 0x20);
            uVar4 = puVar1[1];
            pBVar12 = pBVar17 + lVar18 + 0x20;
            *(undefined8 *)pBVar12 = *puVar1;
            *(undefined8 *)(pBVar12 + 8) = uVar4;
            puVar1 = (undefined8 *)((long)local_c8 + lVar18 + 0x30);
            uVar4 = puVar1[1];
            *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar12 + 0x18) = uVar4;
            lVar18 = lVar18 + 0x20;
          } while (pBVar12 + 0x20 < pBVar17 + uVar15);
        }
        goto LAB_001c34ed;
      }
      seqStore->lit = pBVar17 + uVar15;
    }
    psVar19 = seqStore->sequences;
    psVar19->litLength = (U16)uVar15;
    psVar19->offBase = UVar3;
    if (uVar20 < 3) {
LAB_001c37bb:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar20 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001c3818:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar19->mlBase = (U16)(uVar20 - 3);
    psVar19 = psVar19 + 1;
    seqStore->sequences = psVar19;
    if (local_d0->lazySkipping != 0) {
      local_d0->lazySkipping = 0;
    }
    uVar7 = local_ec;
    for (ip = (int *)((long)piVar16 + uVar20); local_ec = uVar7, piVar16 = ip, ms = local_d0,
        ip <= local_98; ip = (int *)((long)ip + sVar8 + 4)) {
      uVar7 = ((int)ip - (int)local_b8) - local_ec;
      pBVar17 = local_b8;
      if (uVar7 < (uint)local_d8) {
        pBVar17 = local_68;
      }
      if ((0xfffffffc < uVar7 - (uint)local_d8) || (*(int *)(pBVar17 + uVar7) != *ip)) break;
      piVar16 = iEnd;
      if (uVar7 < (uint)local_d8) {
        piVar16 = local_a8;
      }
      sVar8 = ZSTD_count_2segments
                        ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar17 + uVar7) + 4),(BYTE *)iEnd,
                         (BYTE *)piVar16,local_b0);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar19 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001c377d;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001c379c;
      pBVar17 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar17) goto LAB_001c37da;
      if (iEnd < ip) goto LAB_001c37f9;
      if (local_70 < ip) {
        ZSTD_safecopyLiterals(pBVar17,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_70);
      }
      else {
        uVar4 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar17 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar17 + 8) = uVar4;
      }
      psVar19 = seqStore->sequences;
      psVar19->litLength = 0;
      psVar19->offBase = 1;
      if (sVar8 + 4 < 3) goto LAB_001c37bb;
      if (0xffff < sVar8 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c3818;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar19->mlBase = (U16)(sVar8 + 1);
      psVar19 = psVar19 + 1;
      seqStore->sequences = psVar19;
      uVar7 = local_f0;
      local_f0 = local_ec;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dedicatedDictSearch);
}